

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

int bypass_winner_mode_processing
              (MACROBLOCK *x,SPEED_FEATURES *sf,int use_txfm_skip,int actual_txfm_skip,
              PREDICTION_MODE best_mode)

{
  int iVar1;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  PREDICTION_MODE in_R8B;
  int is_txfm_skip;
  uint src_var_thresh;
  int prune_winner_mode_eval_level;
  bool local_35;
  uint local_34;
  
  iVar1 = *(int *)(in_RSI + 0x390);
  if (iVar1 == 1) {
    if (*(uint *)(in_RDI + 0x25640) < 0x40U - (*(int *)(in_RDI + 0x4208) * 0x30) / 0x100) {
      return 1;
    }
  }
  else if (iVar1 == 2) {
    iVar1 = have_newmv_in_inter_mode(in_R8B);
    if ((iVar1 == 0) && (in_ECX != 0)) {
      return 1;
    }
  }
  else if (iVar1 == 3) {
    local_34 = in_ECX;
    if (*(int *)(in_RDI + 0x4208) < 0x80) {
      local_35 = in_ECX != 0 || in_EDX != 0;
      local_34 = (uint)local_35;
    }
    iVar1 = have_newmv_in_inter_mode(in_R8B);
    if ((iVar1 == 0) && (local_34 != 0)) {
      return 1;
    }
  }
  else if (3 < iVar1) {
    if ((4 < *(int *)(in_RSI + 0x36c)) && (*(int *)(in_RDI + 0x4208) < 0x47)) {
      return 0;
    }
    if ((in_EDX != 0) || (in_ECX != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static inline int bypass_winner_mode_processing(const MACROBLOCK *const x,
                                                const SPEED_FEATURES *sf,
                                                int use_txfm_skip,
                                                int actual_txfm_skip,
                                                PREDICTION_MODE best_mode) {
  const int prune_winner_mode_eval_level =
      sf->winner_mode_sf.prune_winner_mode_eval_level;

  // Disable winner mode processing for blocks with low source variance.
  // The aggressiveness of this pruning logic reduces as qindex increases.
  // The threshold decreases linearly from 64 as qindex varies from 0 to 255.
  if (prune_winner_mode_eval_level == 1) {
    const unsigned int src_var_thresh = 64 - 48 * x->qindex / (MAXQ + 1);
    if (x->source_variance < src_var_thresh) return 1;
  } else if (prune_winner_mode_eval_level == 2) {
    // Skip winner mode processing of blocks for which transform turns out to be
    // skip due to nature of eob alone except NEWMV mode.
    if (!have_newmv_in_inter_mode(best_mode) && actual_txfm_skip) return 1;
  } else if (prune_winner_mode_eval_level == 3) {
    // Skip winner mode processing of blocks for which transform turns out to be
    // skip except NEWMV mode and considered based on the quantizer.
    // At high quantizers: Take conservative approach by considering transform
    // skip based on eob alone.
    // At low quantizers: Consider transform skip based on eob nature or RD cost
    // evaluation.
    const int is_txfm_skip =
        x->qindex > 127 ? actual_txfm_skip : actual_txfm_skip || use_txfm_skip;

    if (!have_newmv_in_inter_mode(best_mode) && is_txfm_skip) return 1;
  } else if (prune_winner_mode_eval_level >= 4) {
    // Do not skip winner mode evaluation at low quantizers if normal mode's
    // transform search was too aggressive.
    if (sf->rd_sf.perform_coeff_opt >= 5 && x->qindex <= 70) return 0;

    if (use_txfm_skip || actual_txfm_skip) return 1;
  }

  return 0;
}